

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVectorBase<slang::syntax::VariableDimensionSyntax_*>::reallocateTo
          (SmallVectorBase<slang::syntax::VariableDimensionSyntax_*> *this,size_type newCapacity)

{
  VariableDimensionSyntax **__last;
  EVP_PKEY_CTX *ctx;
  VariableDimensionSyntax **in_RSI;
  SmallVectorBase<slang::syntax::VariableDimensionSyntax_*> *in_RDI;
  pointer newData;
  
  __last = (VariableDimensionSyntax **)operator_new(0x7c7f96);
  begin(in_RDI);
  ctx = (EVP_PKEY_CTX *)end(in_RDI);
  std::
  uninitialized_move<slang::syntax::VariableDimensionSyntax**,slang::syntax::VariableDimensionSyntax**>
            (in_RSI,__last,(VariableDimensionSyntax **)in_RDI);
  cleanup(in_RDI,ctx);
  in_RDI->cap = (size_type)in_RSI;
  in_RDI->data_ = __last;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)::operator new(newCapacity * sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }